

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall DecisionNode::chooseOptimalField(DecisionNode *this)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  int4 iVar4;
  int4 iVar5;
  bool bVar6;
  int4 maxfixed;
  int4 iVar7;
  uint size;
  int4 iVar8;
  double dVar9;
  double local_40;
  
  iVar7 = 1;
  local_40 = 0.0;
  bVar3 = true;
  do {
    bVar6 = (bool)(bVar3 & 1);
    iVar4 = getMaximumLength(this,bVar6);
    if (iVar4 != 0) {
      iVar8 = 0;
      do {
        iVar5 = getNumFixed(this,iVar8,1,bVar6);
        if (iVar7 <= iVar5) {
          dVar9 = getScore(this,iVar8,1,bVar6);
          if (((iVar7 < iVar5) && (0.0 < dVar9)) || (iVar5 = iVar7, local_40 < dVar9)) {
            iVar7 = iVar5;
            this->startbit = iVar8;
            this->bitsize = 1;
            this->contextdecision = (bool)bVar3;
            local_40 = dVar9;
          }
        }
        iVar8 = iVar8 + 1;
      } while (iVar4 * 8 + (uint)(iVar4 * 8 == 0) != iVar8);
    }
    bVar2 = bVar3 & 1;
    bVar3 = bVar3 - 1;
  } while (bVar2 != 0);
  bVar3 = true;
  do {
    bVar6 = (bool)(bVar3 & 1);
    iVar4 = getMaximumLength(this,bVar6);
    iVar1 = iVar4 * 8;
    size = 2;
    do {
      iVar1 = iVar1 + -1;
      if (size <= (uint)(iVar4 << 3)) {
        iVar8 = 0;
        do {
          iVar5 = getNumFixed(this,iVar8,size,bVar6);
          if (iVar7 <= iVar5) {
            dVar9 = getScore(this,iVar8,size,bVar6);
            if (local_40 < dVar9) {
              this->startbit = iVar8;
              this->bitsize = size;
              this->contextdecision = (bool)bVar3;
              local_40 = dVar9;
            }
          }
          iVar8 = iVar8 + 1;
        } while (iVar1 != iVar8);
      }
      size = size + 1;
    } while (size != 9);
    bVar2 = bVar3 & 1;
    bVar3 = bVar3 - 1;
  } while (bVar2 != 0);
  if (local_40 <= 0.0) {
    this->bitsize = 0;
  }
  return;
}

Assistant:

void DecisionNode::chooseOptimalField(void)

{
  double score = 0.0;
  
  int4 sbit,size;		// The current field
  bool context;
  double sc;

  int4 maxlength,numfixed,maxfixed;

  maxfixed = 1;
  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(sbit=0;sbit<maxlength;++sbit) {
      numfixed = getNumFixed(sbit,1,context); // How may patterns specify this bit
      if (numfixed < maxfixed) continue; // Skip this bit, if we don't have maximum specification
      sc = getScore(sbit,1,context);

 // if we got more patterns this time than previously, and a positive score, reset
 // the high score (we prefer this bit, because it has a higher numfixed, regardless
 // of the difference in score, as long as the new score is positive).
      if ((numfixed > maxfixed)&&(sc > 0.0)) {
	score = sc;
	maxfixed = numfixed;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
	continue;
      }
				// We have maximum patterns
      if (sc > score) {
	score = sc;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
      }
    }
    context = !context;
  } while(!context);

  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(size=2;size <= 8;++size) {
      for(sbit=0;sbit<maxlength-size+1;++sbit) {
	if (getNumFixed(sbit,size,context) < maxfixed) continue; // Consider only maximal fields
	sc = getScore(sbit,size,context);
	if (sc > score) {
	  score = sc;
	  startbit = sbit;
	  bitsize = size;
	  contextdecision = context;
	}
      }
    }
    context = !context;
  } while(!context);
  if (score <= 0.0)		// If we failed to get a positive score
    bitsize = 0;		// treat the node as terminal
}